

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O1

void __thiscall
QTcpServer::QTcpServer(QTcpServer *this,SocketType socketType,QTcpServerPrivate *dd,QObject *parent)

{
  QObject::QObject(&this->super_QObject,&dd->super_QObjectPrivate,parent);
  *(undefined ***)this = &PTR_metaObject_002d1f08;
  *(SocketType *)(*(long *)&this->field_0x8 + 0xa8) = socketType;
  return;
}

Assistant:

QTcpServer::QTcpServer(QAbstractSocket::SocketType socketType, QTcpServerPrivate &dd,
                       QObject *parent) : QObject(dd, parent)
{
    Q_D(QTcpServer);
#if defined(QTCPSERVER_DEBUG)
    qDebug("QTcpServer::QTcpServer(%sSocket, QTcpServerPrivate == %p, parent == %p)",
           socketType == QAbstractSocket::TcpSocket ? "Tcp"
           : socketType == QAbstractSocket::UdpSocket ? "Udp"
           : socketType == QAbstractSocket::SctpSocket ? "Sctp"
           : "Unknown", &dd, parent);
#endif
    d->socketType = socketType;
}